

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetCleanCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  string buildcommand;
  string generator;
  ostringstream ss;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostream local_198;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CMAKE_GENERATOR",(allocator<char> *)&local_1f8);
  psVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_198);
  std::__cxx11::string::string((string *)&local_1b8,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1f9);
  GetBuildCommand(&local_1f8,this,mf,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (targetName->_M_string_length != 0) {
    bVar1 = std::operator==(&local_1b8,"Ninja");
    if (bVar1) {
      poVar3 = std::operator<<(&local_198,(string *)&local_1f8);
      poVar3 = std::operator<<(poVar3," -t clean ");
      std::operator<<(poVar3,(string *)targetName);
      goto LAB_002c5674;
    }
  }
  poVar3 = std::operator<<(&local_198,(string *)&local_1f8);
  std::operator<<(poVar3," clean");
LAB_002c5674:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetCleanCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::ostringstream ss;
  std::string buildcommand = GetBuildCommand(mf, "");
  if (!targetName.empty() && generator == "Ninja") {
    ss << buildcommand << " -t clean " << targetName;
  } else {
    ss << buildcommand << " clean";
  }
  return ss.str();
}